

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cn-cbor.c
# Opt level: O0

cn_cbor * decode_item(parse_buf *pb,cn_cbor *top_parent)

{
  uint16_t *puVar1;
  uint16_t uVar2;
  uint uVar3;
  uint uVar4;
  uint32_t uVar5;
  uint16_t *p;
  uint8_t *puVar6;
  float half;
  double dVar7;
  anon_union_8_2_94730072 u64;
  cn_cbor *pcStack_58;
  anon_union_4_2_947300b0 u32;
  cn_cbor *cb;
  uint64_t val;
  int ai;
  uint mt;
  int ib;
  cn_cbor *parent;
  uchar *ebuf;
  uchar *pos;
  cn_cbor *top_parent_local;
  parse_buf *pb_local;
  
  puVar1 = (uint16_t *)pb->ebuf;
  pcStack_58 = (cn_cbor *)0x0;
  _mt = top_parent;
  ebuf = pb->buf;
LAB_0035338a:
  if (puVar1 == (uint16_t *)ebuf) {
    pb->err = CN_CBOR_ERR_OUT_OF_DATA;
    goto LAB_003538fd;
  }
  uVar4 = (uint)*ebuf;
  p = (uint16_t *)(ebuf + 1);
  if (uVar4 == 0xff) {
    if ((_mt->flags & CN_CBOR_FL_INDEF) == 0) {
      pb->err = CN_CBOR_ERR_BREAK_OUTSIDE_INDEF;
      ebuf = (uchar *)p;
    }
    else {
      if (_mt->type - CN_CBOR_BYTES < 2) {
        _mt->type = _mt->type + CN_CBOR_NULL;
        ebuf = (uchar *)p;
        goto LAB_0035389f;
      }
      ebuf = (uchar *)p;
      if (_mt->type != CN_CBOR_MAP) goto LAB_0035389f;
      if ((_mt->length & 1U) == 0) goto LAB_0035389f;
      pb->err = CN_CBOR_ERR_ODD_SIZE_INDEF_MAP;
    }
    goto LAB_003538fd;
  }
  uVar3 = (int)uVar4 >> 5;
  uVar4 = uVar4 & 0x1f;
  cb = (cn_cbor *)(long)(int)uVar4;
  pcStack_58 = (cn_cbor *)calloc(1,0x38);
  if (pcStack_58 == (cn_cbor *)0x0) {
    pb->err = CN_CBOR_ERR_OUT_OF_MEMORY;
    ebuf = (uchar *)p;
    goto LAB_003538fd;
  }
  pcStack_58->type = mt_trans[uVar3];
  pcStack_58->parent = _mt;
  if (_mt->last_child == (cn_cbor *)0x0) {
    _mt->first_child = pcStack_58;
  }
  else {
    _mt->last_child->next = pcStack_58;
  }
  _mt->last_child = pcStack_58;
  _mt->length = _mt->length + 1;
  switch(uVar4) {
  case 0x18:
    if (puVar1 == p) {
      pb->err = CN_CBOR_ERR_OUT_OF_DATA;
      ebuf = (uchar *)p;
      goto LAB_003538fd;
    }
    cb = (cn_cbor *)(ulong)(byte)*p;
    p = (uint16_t *)(ebuf + 2);
    break;
  case 0x19:
    if ((ulong)((long)puVar1 - (long)p) < 2) {
      pb->err = CN_CBOR_ERR_OUT_OF_DATA;
      ebuf = (uchar *)p;
      goto LAB_003538fd;
    }
    uVar2 = ntohs(*p);
    cb = (cn_cbor *)(ulong)uVar2;
    p = (uint16_t *)(ebuf + 3);
    break;
  case 0x1a:
    if ((ulong)((long)puVar1 - (long)p) < 4) {
      pb->err = CN_CBOR_ERR_OUT_OF_DATA;
      ebuf = (uchar *)p;
      goto LAB_003538fd;
    }
    uVar5 = ntohl((uint32_t)*(undefined8 *)p);
    cb = (cn_cbor *)(ulong)uVar5;
    p = (uint16_t *)(ebuf + 5);
    break;
  case 0x1b:
    if ((ulong)((long)puVar1 - (long)p) < 8) {
      pb->err = CN_CBOR_ERR_OUT_OF_DATA;
      ebuf = (uchar *)p;
      goto LAB_003538fd;
    }
    cb = (cn_cbor *)ntoh64p((uchar *)p);
    p = (uint16_t *)(ebuf + 9);
    break;
  case 0x1c:
  case 0x1d:
  case 0x1e:
    pb->err = CN_CBOR_ERR_RESERVED_AI;
    ebuf = (uchar *)p;
    goto LAB_003538fd;
  case 0x1f:
    if (5 < uVar3 - 2) {
      pb->err = CN_CBOR_ERR_MT_UNDEF_FOR_INDEF;
      ebuf = (uchar *)p;
      goto LAB_003538fd;
    }
    pcStack_58->flags = pcStack_58->flags | CN_CBOR_FL_INDEF;
    _mt = pcStack_58;
    ebuf = (uchar *)p;
    goto LAB_0035338a;
  }
  ebuf = (uchar *)p;
  half = SUB84(cb,0);
  switch(uVar3) {
  case 0:
    (pcStack_58->v).bytes = (uint8_t *)cb;
    break;
  case 1:
    (pcStack_58->v).uint = (ulong)cb ^ 0xffffffffffffffff;
    break;
  case 2:
  case 3:
    (pcStack_58->v).bytes = ebuf;
    pcStack_58->length = (int)half;
    if ((cn_cbor *)((long)puVar1 - (long)ebuf) < cb) {
      pb->err = CN_CBOR_ERR_OUT_OF_DATA;
      goto LAB_003538fd;
    }
    ebuf = ebuf + (long)&cb->type;
    break;
  case 4:
    goto switchD_00353696_caseD_4;
  case 5:
    cb = (cn_cbor *)((long)cb << 1);
switchD_00353696_caseD_4:
    (pcStack_58->v).bytes = (uint8_t *)cb;
    if (cb != (cn_cbor *)0x0) {
      pcStack_58->flags = pcStack_58->flags | CN_CBOR_FL_COUNT;
      _mt = pcStack_58;
      goto LAB_0035338a;
    }
    break;
  case 6:
    (pcStack_58->v).bytes = (uint8_t *)cb;
    _mt = pcStack_58;
    goto LAB_0035338a;
  case 7:
    switch(uVar4) {
    case 0x14:
      pcStack_58->type = CN_CBOR_FALSE;
      break;
    case 0x15:
      pcStack_58->type = CN_CBOR_TRUE;
      break;
    case 0x16:
      pcStack_58->type = CN_CBOR_NULL;
      break;
    case 0x17:
      pcStack_58->type = CN_CBOR_UNDEF;
      break;
    default:
      (pcStack_58->v).bytes = (uint8_t *)cb;
      break;
    case 0x19:
      pcStack_58->type = CN_CBOR_DOUBLE;
      dVar7 = decode_half((int)half);
      (pcStack_58->v).dbl = dVar7;
      break;
    case 0x1a:
      pcStack_58->type = CN_CBOR_DOUBLE;
      (pcStack_58->v).dbl = (double)half;
      break;
    case 0x1b:
      pcStack_58->type = CN_CBOR_DOUBLE;
      (pcStack_58->v).bytes = (uint8_t *)cb;
    }
  }
  for (; (_mt->flags & CN_CBOR_FL_INDEF) == 0; _mt = _mt->parent) {
    if (((_mt->flags & CN_CBOR_FL_COUNT) != 0) &&
       (puVar6 = (uint8_t *)((_mt->v).sint + -1), (_mt->v).bytes = puVar6, puVar6 != (uint8_t *)0x0)
       ) goto LAB_0035338a;
LAB_0035389f:
    if (_mt == top_parent) {
      if ((uint16_t *)ebuf == puVar1) {
        pb->buf = ebuf;
        return pcStack_58;
      }
      pb->err = CN_CBOR_ERR_NOT_ALL_DATA_CONSUMED;
      goto LAB_003538fd;
    }
    pcStack_58 = _mt;
  }
  if (((_mt->type == CN_CBOR_BYTES) || (_mt->type == CN_CBOR_TEXT)) &&
     (pcStack_58->type != _mt->type)) {
    pb->err = CN_CBOR_ERR_WRONG_NESTING_IN_INDEF_STRING;
LAB_003538fd:
    pb->buf = ebuf;
    return (cn_cbor *)0x0;
  }
  goto LAB_0035338a;
}

Assistant:

static cn_cbor *decode_item (struct parse_buf *pb CBOR_CONTEXT, cn_cbor* top_parent) {
  unsigned char *pos = pb->buf;
  unsigned char *ebuf = pb->ebuf;
  cn_cbor* parent = top_parent;
  int ib;
  unsigned int mt;
  int ai;
  uint64_t val;
  cn_cbor* cb = NULL;
#ifndef CBOR_NO_FLOAT
  union {
    float f;
    uint32_t u;
  } u32;
  union {
    double d;
    uint64_t u;
  } u64;
#endif /* CBOR_NO_FLOAT */

again:
  TAKE(pos, ebuf, 1, ib = ntoh8p(pos) );
  if (ib == IB_BREAK) {
    if (!(parent->flags & CN_CBOR_FL_INDEF))
      CN_CBOR_FAIL(CN_CBOR_ERR_BREAK_OUTSIDE_INDEF);
    switch (parent->type) {
    case CN_CBOR_BYTES: case CN_CBOR_TEXT:
      parent->type += 2;            /* CN_CBOR_* -> CN_CBOR_*_CHUNKED */
      break;
    case CN_CBOR_MAP:
      if (parent->length & 1)
        CN_CBOR_FAIL(CN_CBOR_ERR_ODD_SIZE_INDEF_MAP);
    default:;
    }
    goto complete;
  }
  mt = ib >> 5;
  ai = ib & 0x1f;
  val = ai;

  cb = CN_CALLOC_CONTEXT();
  if (!cb)
    CN_CBOR_FAIL(CN_CBOR_ERR_OUT_OF_MEMORY);

  cb->type = mt_trans[mt];

  cb->parent = parent;
  if (parent->last_child) {
    parent->last_child->next = cb;
  } else {
    parent->first_child = cb;
  }
  parent->last_child = cb;
  parent->length++;

  switch (ai) {
  case AI_1: TAKE(pos, ebuf, 1, val = ntoh8p(pos)) ; break;
  case AI_2: TAKE(pos, ebuf, 2, val = ntoh16p(pos)) ; break;
  case AI_4: TAKE(pos, ebuf, 4, val = ntoh32p(pos)) ; break;
  case AI_8: TAKE(pos, ebuf, 8, val = ntoh64p(pos)) ; break;
  case 28: case 29: case 30: CN_CBOR_FAIL(CN_CBOR_ERR_RESERVED_AI);
  case AI_INDEF:
    if ((mt - MT_BYTES) <= MT_MAP) {
      cb->flags |= CN_CBOR_FL_INDEF;
      goto push;
    } else {
      CN_CBOR_FAIL(CN_CBOR_ERR_MT_UNDEF_FOR_INDEF);
    }
  }
  // process content
  switch (mt) {
  case MT_UNSIGNED:
    cb->v.uint = val;           /* to do: Overflow check */
    break;
  case MT_NEGATIVE:
    cb->v.sint = ~val;          /* to do: Overflow check */
    break;
  case MT_BYTES: case MT_TEXT:
    cb->v.str = (char *) pos;
    cb->length = (size_t) val;
    TAKE(pos, ebuf, val, ;);
    break;
  case MT_MAP:
    val <<= 1;
    /* fall through */
  case MT_ARRAY:
    if ((cb->v.count = val)) {
      cb->flags |= CN_CBOR_FL_COUNT;
      goto push;
    }
    break;
  case MT_TAG:
    cb->v.uint = val;
    goto push;
  case MT_PRIM:
    switch (ai) {
    case VAL_FALSE: cb->type = CN_CBOR_FALSE; break;
    case VAL_TRUE:  cb->type = CN_CBOR_TRUE;  break;
    case VAL_NIL:   cb->type = CN_CBOR_NULL;  break;
    case VAL_UNDEF: cb->type = CN_CBOR_UNDEF; break;
    case AI_2:
#ifndef CBOR_NO_FLOAT
      cb->type = CN_CBOR_DOUBLE;
      cb->v.dbl = decode_half(val);
#else /*  CBOR_NO_FLOAT */
      CN_CBOR_FAIL(CN_CBOR_ERR_FLOAT_NOT_SUPPORTED);
#endif /*  CBOR_NO_FLOAT */
      break;
    case AI_4:
#ifndef CBOR_NO_FLOAT
      cb->type = CN_CBOR_DOUBLE;
      u32.u = (uint32_t) val;
      cb->v.dbl = u32.f;
#else /*  CBOR_NO_FLOAT */
      CN_CBOR_FAIL(CN_CBOR_ERR_FLOAT_NOT_SUPPORTED);
#endif /*  CBOR_NO_FLOAT */
      break;
    case AI_8:
#ifndef CBOR_NO_FLOAT
      cb->type = CN_CBOR_DOUBLE;
      u64.u = val;
      cb->v.dbl = u64.d;
#else /*  CBOR_NO_FLOAT */
      CN_CBOR_FAIL(CN_CBOR_ERR_FLOAT_NOT_SUPPORTED);
#endif /*  CBOR_NO_FLOAT */
      break;
    default: cb->v.uint = val;
    }
  }
fill:                           /* emulate loops */
  if (parent->flags & CN_CBOR_FL_INDEF) {
    if (parent->type == CN_CBOR_BYTES || parent->type == CN_CBOR_TEXT)
      if (cb->type != parent->type)
          CN_CBOR_FAIL(CN_CBOR_ERR_WRONG_NESTING_IN_INDEF_STRING);
    goto again;
  }
  if (parent->flags & CN_CBOR_FL_COUNT) {
    if (--parent->v.count)
      goto again;
  }
  /* so we are done filling parent. */
complete:                       /* emulate return from call */
  if (parent == top_parent) {
    if (pos != ebuf)            /* XXX do this outside */
      CN_CBOR_FAIL(CN_CBOR_ERR_NOT_ALL_DATA_CONSUMED);
    pb->buf = pos;
    return cb;
  }
  cb = parent;
  parent = parent->parent;
  goto fill;
push:                           /* emulate recursive call */
  parent = cb;
  goto again;
fail:
  pb->buf = pos;
  return 0;
}